

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

bool __thiscall
YacclabTests::SaveBroadOutputResults
          (YacclabTests *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
          *results,string *o_filename,Mat1i *labels,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms)

{
  double dVar1;
  pointer pbVar2;
  pointer ppVar3;
  char cVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  pointer pbVar7;
  int step_number;
  long lVar8;
  int iVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  Mat1d results_reduced;
  ofstream os;
  
  std::ofstream::ofstream(&os,(string *)o_filename,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    poVar5 = std::operator<<((ostream *)&os,"#");
    std::operator<<(poVar5,'\t');
    pbVar2 = (ccl_algorithms->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (ccl_algorithms->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1)
    {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
               ::at(results,pbVar7);
      cv::Mat_<double>::Mat_(&results_reduced,1,*(int *)&pmVar6->field_0xc);
      local_2b0._M_string_length =
           (size_type)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
           ::at(results,pbVar7);
      local_2b0.field_2._M_allocated_capacity = 0;
      local_2d0.field_2._M_allocated_capacity = 0;
      local_2b0._M_dataplus._M_p._0_4_ = 0x81010006;
      local_2d0._M_dataplus._M_p._0_4_ = 0x82010006;
      local_2d0._M_string_length = (size_type)&results_reduced;
      cv::reduce((_InputArray *)&local_2b0,(_OutputArray *)&local_2d0,0,2,-1);
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        dVar1 = *(double *)(results_reduced._16_8_ + lVar8 * 8);
        if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
          std::operator+(&local_2b0,pbVar7,"_");
          poVar5 = std::operator<<((ostream *)&os,(string *)&local_2b0);
          Step_abi_cxx11_(&local_2d0,(StepType)lVar8);
          poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
          std::operator<<(poVar5,'\t');
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2b0);
        }
      }
      cv::Mat::~Mat(&results_reduced.super_Mat);
    }
    std::operator<<((ostream *)&os,'\n');
    uVar10 = 0;
    while( true ) {
      iVar9 = (int)uVar10;
      ppVar3 = (filenames->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(filenames->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) / 0x28) <=
          uVar10) break;
      if (ppVar3[uVar10].second == true) {
        poVar5 = std::operator<<((ostream *)&os,(string *)(ppVar3 + uVar10));
        std::operator<<(poVar5,'\t');
        pbVar2 = (ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar7 = (ccl_algorithms->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2;
            pbVar7 = pbVar7 + 1) {
          for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                     ::at(results,pbVar7);
            dVar1 = *(double *)
                     (**(long **)&pmVar6->field_0x48 * (long)iVar9 + *(long *)&pmVar6->field_0x10 +
                     lVar8 * 8);
            if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                       ::at(results,pbVar7);
              poVar5 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   (**(long **)&pmVar6->field_0x48 * (long)iVar9 +
                                    *(long *)&pmVar6->field_0x10 + lVar8 * 8));
              std::operator<<(poVar5,'\t');
            }
          }
        }
        std::operator<<((ostream *)&os,'\n');
      }
      uVar10 = (ulong)(iVar9 + 1);
    }
  }
  std::ofstream::~ofstream(&os);
  return (bool)cVar4;
}

Assistant:

bool YacclabTests::SaveBroadOutputResults(std::map<std::string, cv::Mat1d>& results, const std::string& o_filename, const cv::Mat1i& labels,
    const std::vector<std::pair<std::string, bool>>& filenames, const std::vector<std::string>& ccl_algorithms) {
    std::ofstream os(o_filename);
    if (!os.is_open()) {
        return false;
    }

    // To set heading file format
    os << "#" << '\t';
    for (const auto& algo_name : ccl_algorithms) {

        // Calculate the max of the columns to find unused steps
        cv::Mat1d results_reduced(1, results.at(algo_name).cols);
#if OPENCV_VERSION_MAJOR >= 4
        cv::reduce(results.at(algo_name), results_reduced, 0, cv::REDUCE_MAX);
#else
        cv::reduce(results.at(algo_name), results_reduced, 0, CV_REDUCE_MAX);
        cv::reduce(results.at(algo_name), results_reduced, 0, CV_REDUCE_MAX);
#endif

        for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
            StepType step = static_cast<StepType>(step_number);
            double column_value(results_reduced(0, step_number));
            if (column_value != std::numeric_limits<double>::max()) {
                os << algo_name + "_" << Step(step) << '\t';
            }
        }
    }
    os << '\n';

    for (unsigned files = 0; files < filenames.size(); ++files) {
        if (filenames[files].second) {
            os << filenames[files].first << '\t';
            unsigned i = 0;
            for (const auto& algo_name : ccl_algorithms) {
                for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
                    if (results.at(algo_name)(files, step_number) != std::numeric_limits<double>::max()) {
                        os << results.at(algo_name)(files, step_number) << '\t';
                    }
                    else {
                        // Step not held, skipped
                        //os << 0 << '\t';
                    }
                }
                ++i;
            }
            os << '\n';
        }
    }

    return true;
}